

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O0

Ivy_Man_t * Ivy_ManDup(Ivy_Man_t *p)

{
  Vec_Ptr_t *p_00;
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  Ivy_Man_t *p_01;
  Ivy_Obj_t *pIVar4;
  Ivy_Obj_t *pIVar5;
  bool bVar6;
  int local_34;
  Ivy_Obj_t *pIStack_30;
  int i;
  Ivy_Obj_t *pObj;
  Ivy_Man_t *pNew;
  Vec_Int_t *vLatches;
  Vec_Int_t *vNodes;
  Ivy_Man_t *p_local;
  
  vNodes = (Vec_Int_t *)p;
  vLatches = Ivy_ManDfsSeq(p,(Vec_Int_t **)&pNew);
  p_01 = Ivy_ManStart();
  pIVar4 = Ivy_ManConst1(p_01);
  pIVar5 = Ivy_ManConst1((Ivy_Man_t *)vNodes);
  pIVar5->pEquiv = pIVar4;
  for (local_34 = 0; iVar2 = Vec_PtrSize(*(Vec_Ptr_t **)vNodes), local_34 < iVar2;
      local_34 = local_34 + 1) {
    pIStack_30 = (Ivy_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)vNodes,local_34);
    pIVar4 = Ivy_ObjCreatePi(p_01);
    pIStack_30->pEquiv = pIVar4;
  }
  local_34 = 0;
  while( true ) {
    iVar2 = Vec_IntSize((Vec_Int_t *)pNew);
    pVVar1 = vNodes;
    bVar6 = false;
    if (local_34 < iVar2) {
      iVar2 = Vec_IntEntry((Vec_Int_t *)pNew,local_34);
      pIStack_30 = Ivy_ManObj((Ivy_Man_t *)pVVar1,iVar2);
      bVar6 = pIStack_30 != (Ivy_Obj_t *)0x0;
    }
    if (!bVar6) break;
    pIVar4 = Ivy_ObjCreatePi(p_01);
    pIStack_30->pEquiv = pIVar4;
    local_34 = local_34 + 1;
  }
  local_34 = 0;
  while( true ) {
    iVar2 = Vec_IntSize(vLatches);
    pVVar1 = vNodes;
    bVar6 = false;
    if (local_34 < iVar2) {
      iVar2 = Vec_IntEntry(vLatches,local_34);
      pIStack_30 = Ivy_ManObj((Ivy_Man_t *)pVVar1,iVar2);
      bVar6 = pIStack_30 != (Ivy_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar2 = Ivy_ObjIsBuf(pIStack_30);
    if (iVar2 == 0) {
      pIVar4 = Ivy_ObjChild0Equiv(pIStack_30);
      pIVar5 = Ivy_ObjChild1Equiv(pIStack_30);
      pIVar4 = Ivy_And(p_01,pIVar4,pIVar5);
      pIStack_30->pEquiv = pIVar4;
    }
    else {
      pIVar4 = Ivy_ObjChild0Equiv(pIStack_30);
      pIStack_30->pEquiv = pIVar4;
    }
    local_34 = local_34 + 1;
  }
  for (local_34 = 0; iVar2 = Vec_PtrSize((Vec_Ptr_t *)vNodes->pArray), local_34 < iVar2;
      local_34 = local_34 + 1) {
    pIStack_30 = (Ivy_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)vNodes->pArray,local_34);
    pIVar4 = Ivy_ObjChild0Equiv(pIStack_30);
    Ivy_ObjCreatePo(p_01,pIVar4);
  }
  local_34 = 0;
  while( true ) {
    iVar2 = Vec_IntSize((Vec_Int_t *)pNew);
    pVVar1 = vNodes;
    bVar6 = false;
    if (local_34 < iVar2) {
      iVar2 = Vec_IntEntry((Vec_Int_t *)pNew,local_34);
      pIStack_30 = Ivy_ManObj((Ivy_Man_t *)pVVar1,iVar2);
      bVar6 = pIStack_30 != (Ivy_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar2 = Ivy_ObjFaninC0(pIStack_30);
    if (iVar2 != 0) {
      __assert_fail("!Ivy_ObjFaninC0(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyMan.c"
                    ,0x8b,"Ivy_Man_t *Ivy_ManDup(Ivy_Man_t *)");
    }
    *(uint *)&pIStack_30->pEquiv->field_0x8 =
         *(uint *)&pIStack_30->pEquiv->field_0x8 & 0xfffffff0 | 4;
    *(uint *)&pIStack_30->pEquiv->field_0x8 =
         *(uint *)&pIStack_30->pEquiv->field_0x8 & 0xfffff9ff |
         (*(uint *)&pIStack_30->field_0x8 >> 9 & 3) << 9;
    pIVar4 = pIStack_30->pEquiv;
    pIVar5 = Ivy_ObjChild0Equiv(pIStack_30);
    Ivy_ObjConnect(p_01,pIVar4,pIVar5,(Ivy_Obj_t *)0x0);
    local_34 = local_34 + 1;
  }
  p_00 = p_01->vPis;
  iVar2 = Ivy_ManPiNum((Ivy_Man_t *)vNodes);
  Vec_PtrShrink(p_00,iVar2);
  iVar2 = Ivy_ManLatchNum((Ivy_Man_t *)vNodes);
  p_01->nObjs[1] = p_01->nObjs[1] - iVar2;
  iVar2 = Ivy_ManLatchNum((Ivy_Man_t *)vNodes);
  p_01->nObjs[4] = iVar2 + p_01->nObjs[4];
  Vec_IntFree(vLatches);
  Vec_IntFree((Vec_Int_t *)pNew);
  iVar2 = Ivy_ManNodeNum((Ivy_Man_t *)vNodes);
  iVar3 = Ivy_ManNodeNum(p_01);
  if (iVar2 != iVar3) {
    __assert_fail("Ivy_ManNodeNum(p) == Ivy_ManNodeNum(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyMan.c"
                  ,0x99,"Ivy_Man_t *Ivy_ManDup(Ivy_Man_t *)");
  }
  iVar2 = Ivy_ManLatchNum((Ivy_Man_t *)vNodes);
  iVar3 = Ivy_ManLatchNum(p_01);
  if (iVar2 != iVar3) {
    __assert_fail("Ivy_ManLatchNum(p) == Ivy_ManLatchNum(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyMan.c"
                  ,0x9a,"Ivy_Man_t *Ivy_ManDup(Ivy_Man_t *)");
  }
  iVar2 = Ivy_ManCheck(p_01);
  if (iVar2 == 0) {
    printf("Ivy_ManMakeSeq(): The check has failed.\n");
  }
  return p_01;
}

Assistant:

Ivy_Man_t * Ivy_ManDup( Ivy_Man_t * p )
{
    Vec_Int_t * vNodes, * vLatches;
    Ivy_Man_t * pNew;
    Ivy_Obj_t * pObj;
    int i;
    // collect latches and nodes in the DFS order
    vNodes = Ivy_ManDfsSeq( p, &vLatches );
    // create the new manager
    pNew = Ivy_ManStart();
    // create the PIs
    Ivy_ManConst1(p)->pEquiv = Ivy_ManConst1(pNew);
    Ivy_ManForEachPi( p, pObj, i )
        pObj->pEquiv = Ivy_ObjCreatePi(pNew);
    // create the fake PIs for latches
    Ivy_ManForEachNodeVec( p, vLatches, pObj, i )
        pObj->pEquiv = Ivy_ObjCreatePi(pNew);
    // duplicate internal nodes
    Ivy_ManForEachNodeVec( p, vNodes, pObj, i )
        if ( Ivy_ObjIsBuf(pObj) )
            pObj->pEquiv = Ivy_ObjChild0Equiv(pObj);
        else
            pObj->pEquiv = Ivy_And( pNew, Ivy_ObjChild0Equiv(pObj), Ivy_ObjChild1Equiv(pObj) );
    // add the POs
    Ivy_ManForEachPo( p, pObj, i )
        Ivy_ObjCreatePo( pNew, Ivy_ObjChild0Equiv(pObj) );
    // transform additional PI nodes into latches and connect them
    Ivy_ManForEachNodeVec( p, vLatches, pObj, i )
    {
        assert( !Ivy_ObjFaninC0(pObj) );
        pObj->pEquiv->Type = IVY_LATCH;
        pObj->pEquiv->Init = pObj->Init;
        Ivy_ObjConnect( pNew, pObj->pEquiv, Ivy_ObjChild0Equiv(pObj), NULL );
    }
    // shrink the arrays
    Vec_PtrShrink( pNew->vPis, Ivy_ManPiNum(p) );
    // update the counters of different objects
    pNew->nObjs[IVY_PI] -= Ivy_ManLatchNum(p);
    pNew->nObjs[IVY_LATCH] += Ivy_ManLatchNum(p);
    // free arrays
    Vec_IntFree( vNodes );
    Vec_IntFree( vLatches );
    // make sure structural hashing did not change anything
    assert( Ivy_ManNodeNum(p)  == Ivy_ManNodeNum(pNew) );
    assert( Ivy_ManLatchNum(p) == Ivy_ManLatchNum(pNew) );
    // check the resulting network
    if ( !Ivy_ManCheck(pNew) )
        printf( "Ivy_ManMakeSeq(): The check has failed.\n" );
    return pNew;
}